

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaMappingHysteresis::PostUnmap(VmaMappingHysteresis *this)

{
  uint uVar1;
  int iVar2;
  
  if (this->m_ExtraMapping == 0) {
    this->m_MajorCounter = this->m_MajorCounter + 1;
    return;
  }
  uVar1 = this->m_MajorCounter;
  if (this->m_MinorCounter < uVar1) {
    iVar2 = 1;
  }
  else {
    if (uVar1 == 0) {
      return;
    }
    this->m_MajorCounter = uVar1 - 1;
    iVar2 = -1;
  }
  this->m_MinorCounter = this->m_MinorCounter + iVar2;
  return;
}

Assistant:

void PostUnmap()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 0)
            ++m_MajorCounter;
        else // m_ExtraMapping == 1
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
    }